

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

size_t ma_dr_wav_read_raw(ma_dr_wav *pWav,size_t bytesToRead,void *pBufferOut)

{
  uint uVar1;
  ma_bool32 mVar2;
  size_t sVar3;
  size_t sVar4;
  uint uVar5;
  ulong uVar6;
  size_t bytesToSeek;
  ma_uint8 buffer [4096];
  undefined1 local_1038 [4104];
  
  if (bytesToRead != 0 && pWav != (ma_dr_wav *)0x0) {
    uVar6 = pWav->bytesRemaining;
    if (uVar6 < bytesToRead) {
      bytesToRead = uVar6;
    }
    if (uVar6 != 0) {
      if ((pWav->bitsPerSample & 7) == 0) {
        uVar1 = (uint)(pWav->fmt).channels * (uint)pWav->bitsPerSample >> 3;
      }
      else {
        uVar1 = (uint)(pWav->fmt).blockAlign;
      }
      if (((pWav->translatedFormatTag & 0xfffe) != 6) || (uVar5 = 0, uVar1 == (pWav->fmt).channels))
      {
        uVar5 = uVar1;
      }
      if (uVar5 != 0) {
        if (pBufferOut == (void *)0x0) {
          sVar3 = 0;
          do {
            uVar6 = bytesToRead - sVar3;
            if (bytesToRead < sVar3 || uVar6 == 0) break;
            if (0x7ffffffe < uVar6) {
              uVar6 = 0x7fffffff;
            }
            mVar2 = (*pWav->onSeek)(pWav->pUserData,(int)uVar6,ma_dr_wav_seek_origin_current);
            if (mVar2 == 0) {
              uVar6 = 0;
            }
            sVar3 = sVar3 + uVar6;
          } while (mVar2 != 0);
          do {
            uVar6 = bytesToRead - sVar3;
            if (bytesToRead < sVar3 || uVar6 == 0) break;
            if (0xfff < uVar6) {
              uVar6 = 0x1000;
            }
            sVar4 = (*pWav->onRead)(pWav->pUserData,local_1038,uVar6);
            sVar3 = sVar3 + sVar4;
          } while (uVar6 <= sVar4);
        }
        else {
          sVar3 = (*pWav->onRead)(pWav->pUserData,pBufferOut,bytesToRead);
        }
        pWav->readCursorInPCMFrames = pWav->readCursorInPCMFrames + sVar3 / uVar5;
        pWav->bytesRemaining = pWav->bytesRemaining - sVar3;
        return sVar3;
      }
    }
  }
  return 0;
}

Assistant:

MA_API size_t ma_dr_wav_read_raw(ma_dr_wav* pWav, size_t bytesToRead, void* pBufferOut)
{
    size_t bytesRead;
    ma_uint32 bytesPerFrame;
    if (pWav == NULL || bytesToRead == 0) {
        return 0;
    }
    if (bytesToRead > pWav->bytesRemaining) {
        bytesToRead = (size_t)pWav->bytesRemaining;
    }
    if (bytesToRead == 0) {
        return 0;
    }
    bytesPerFrame = ma_dr_wav_get_bytes_per_pcm_frame(pWav);
    if (bytesPerFrame == 0) {
        return 0;
    }
    if (pBufferOut != NULL) {
        bytesRead = pWav->onRead(pWav->pUserData, pBufferOut, bytesToRead);
    } else {
        bytesRead = 0;
        while (bytesRead < bytesToRead) {
            size_t bytesToSeek = (bytesToRead - bytesRead);
            if (bytesToSeek > 0x7FFFFFFF) {
                bytesToSeek = 0x7FFFFFFF;
            }
            if (pWav->onSeek(pWav->pUserData, (int)bytesToSeek, ma_dr_wav_seek_origin_current) == MA_FALSE) {
                break;
            }
            bytesRead += bytesToSeek;
        }
        while (bytesRead < bytesToRead) {
            ma_uint8 buffer[4096];
            size_t bytesSeeked;
            size_t bytesToSeek = (bytesToRead - bytesRead);
            if (bytesToSeek > sizeof(buffer)) {
                bytesToSeek = sizeof(buffer);
            }
            bytesSeeked = pWav->onRead(pWav->pUserData, buffer, bytesToSeek);
            bytesRead += bytesSeeked;
            if (bytesSeeked < bytesToSeek) {
                break;
            }
        }
    }
    pWav->readCursorInPCMFrames += bytesRead / bytesPerFrame;
    pWav->bytesRemaining -= bytesRead;
    return bytesRead;
}